

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

void GetCombinedEntropyUnrefined_C
               (uint32_t *X,uint32_t *Y,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint64_t uVar15;
  bool bVar16;
  
  uVar14 = *Y + *X;
  uVar11 = 0;
  stats->streaks[1] = (int  [2])0x0;
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffff;
  if (length < 2) {
    uVar15 = 0;
    iVar12 = 0;
    uVar10 = 0;
    uVar9 = 0;
    length = 1;
  }
  else {
    uVar8 = 1;
    uVar11 = 0;
    uVar15 = 0;
    lVar13 = 0;
    uVar10 = 0;
    uVar9 = 0;
    do {
      uVar2 = Y[uVar8];
      uVar3 = X[uVar8];
      if (uVar2 + uVar3 != uVar14) {
        uVar5 = (uint32_t)uVar8;
        if (uVar14 != 0) {
          uVar10 = uVar10 + (uVar5 - uVar9) * uVar14;
          bit_entropy->sum = uVar10;
          lVar13 = ((int)lVar13 - uVar9) + uVar8;
          bit_entropy->nonzeros = (int)lVar13;
          bit_entropy->nonzero_code = uVar9;
          if (uVar14 < 0x100) {
            uVar6 = kSLog2Table[uVar14];
          }
          else {
            uVar6 = (*VP8LFastSLog2Slow)(uVar14);
          }
          uVar15 = uVar15 + (uVar8 - (long)(int)uVar9) * uVar6;
          bit_entropy->entropy = uVar15;
          if (uVar11 < uVar14) {
            bit_entropy->max_val = uVar14;
            uVar11 = uVar14;
          }
        }
        bVar4 = 3 < (int)(uVar5 - uVar9);
        bVar16 = uVar14 != 0;
        stats->counts[bVar16] = stats->counts[bVar16] + (uint)bVar4;
        stats->streaks[bVar16][bVar4] = (stats->streaks[bVar16][bVar4] - uVar9) + uVar5;
        uVar14 = uVar2 + uVar3;
        uVar9 = uVar5;
      }
      iVar12 = (int)lVar13;
      uVar8 = uVar8 + 1;
    } while ((uint)length != uVar8);
  }
  iVar7 = length - uVar9;
  if (uVar14 != 0) {
    uVar10 = uVar10 + iVar7 * uVar14;
    bit_entropy->sum = uVar10;
    bit_entropy->nonzeros = iVar12 + iVar7;
    bit_entropy->nonzero_code = uVar9;
    if (uVar14 < 0x100) {
      uVar6 = kSLog2Table[uVar14];
    }
    else {
      uVar6 = (*VP8LFastSLog2Slow)(uVar14);
    }
    uVar15 = uVar15 + (long)iVar7 * uVar6;
    if (uVar11 < uVar14) {
      bit_entropy->max_val = uVar14;
    }
  }
  stats->counts[uVar14 != 0] = stats->counts[uVar14 != 0] + (uint)(3 < iVar7);
  piVar1 = stats->streaks[uVar14 != 0] + (3 < iVar7);
  *piVar1 = *piVar1 + iVar7;
  if (uVar10 < 0x100) {
    uVar6 = kSLog2Table[uVar10];
  }
  else {
    uVar6 = (*VP8LFastSLog2Slow)(uVar10);
  }
  bit_entropy->entropy = uVar6 - uVar15;
  return;
}

Assistant:

static void GetCombinedEntropyUnrefined_C(
    const uint32_t X[], const uint32_t Y[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i = 1;
  int i_prev = 0;
  uint32_t xy_prev = X[0] + Y[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t xy = X[i] + Y[i];
    if (xy != xy_prev) {
      GetEntropyUnrefinedHelper(xy, i, &xy_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &xy_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}